

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O2

int adios2::TypeElementSize(DataType adiosvartype)

{
  if (adiosvartype - Int8 < 0xe) {
    return *(int *)(&DAT_006cc120 + (ulong)(adiosvartype - Int8) * 4);
  }
  return -1;
}

Assistant:

int TypeElementSize(DataType adiosvartype)
{
    switch (adiosvartype)
    {
    case DataType::UInt8:
        return 1;
    case DataType::Int8:
        return 1;
    case DataType::String:
        return -1;
    case DataType::UInt16:
        return 2;
    case DataType::Int16:
        return 2;
    case DataType::UInt32:
        return 4;
    case DataType::Int32:
        return 4;
    case DataType::UInt64:
        return 8;
    case DataType::Int64:
        return 8;
    case DataType::Float:
        return 4;
    case DataType::Double:
        return 8;
    case DataType::FloatComplex:
        return 8;
    case DataType::DoubleComplex:
        return 16;
    case DataType::LongDouble:
        return 16;
    default:
        return -1;
    }
}